

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__node
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  xmlChar **ppxVar1;
  ParserChar *text;
  undefined8 uVar2;
  bool bVar3;
  byte *pbVar4;
  code *pcVar5;
  StringHash SVar6;
  undefined8 *puVar7;
  ParserChar *text_00;
  bool local_41;
  undefined8 *local_40;
  XSList<GeneratedSaxParser::ParserString> *local_38;
  
  pbVar4 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x38);
  uVar2 = node__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)pbVar4 = node__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(pbVar4 + 8) = uVar2;
  uVar2 = node__AttributeData::DEFAULT._24_8_;
  *(undefined8 *)(pbVar4 + 0x10) = node__AttributeData::DEFAULT._16_8_;
  *(undefined8 *)(pbVar4 + 0x18) = uVar2;
  uVar2 = node__AttributeData::DEFAULT._40_8_;
  *(undefined8 *)(pbVar4 + 0x20) = node__AttributeData::DEFAULT._32_8_;
  *(undefined8 *)(pbVar4 + 0x28) = uVar2;
  *(undefined8 *)(pbVar4 + 0x30) = node__AttributeData::DEFAULT._48_8_;
  *attributeDataPtr = pbVar4;
  ppxVar1 = attributes->attributes;
  if ((ppxVar1 != (xmlChar **)0x0) && (text_00 = *ppxVar1, text_00 != (ParserChar *)0x0)) {
    local_38 = (XSList<GeneratedSaxParser::ParserString> *)(pbVar4 + 0x28);
    local_40 = &DAT_008373b0;
    do {
      pcVar5 = (code *)GeneratedSaxParser::Utils::calculateStringHash(text_00);
      text = ppxVar1[1];
      if ((long)pcVar5 < 0x74835) {
        if (pcVar5 == (code *)0x6f4) {
          *(ParserChar **)(pbVar4 + 8) = text;
        }
        else if (pcVar5 == (code *)0x79f4) {
          *(ParserChar **)(pbVar4 + 0x18) = text;
        }
        else {
LAB_0072992b:
          bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0x755a5,text_00,text);
LAB_0072996a:
          if (bVar3 != false) {
            return false;
          }
        }
      }
      else if (pcVar5 == (code *)0x74835) {
        *(ParserChar **)(pbVar4 + 0x10) = text;
      }
      else if (pcVar5 == (code *)0x7c065) {
        SVar6 = GeneratedSaxParser::Utils::calculateStringHash(text,&local_41);
        puVar7 = &ENUM__node_enumMap;
        if ((SVar6 == 0x4f3e34) || (puVar7 = local_40, SVar6 == 0x53385)) {
          *(undefined4 *)(pbVar4 + 0x20) = *(undefined4 *)(puVar7 + 1);
        }
        else {
          local_41 = true;
          pbVar4[0x20] = 2;
          pbVar4[0x21] = 0;
          pbVar4[0x22] = 0;
          pbVar4[0x23] = 0;
          bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x755a5,0x7c065,text);
          if (bVar3) {
            return false;
          }
        }
      }
      else {
        if (pcVar5 != _freeAttributes__falloff_exponent) goto LAB_0072992b;
        bVar3 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ::
                characterData2List<GeneratedSaxParser::ParserString,_&GeneratedSaxParser::Utils::toStringListItem>
                          (&this->
                            super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                           ,text,local_38);
        if (!bVar3) {
          bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x755a5,0x728fc2,text);
          goto LAB_0072996a;
        }
        *pbVar4 = *pbVar4 | 1;
      }
      text_00 = ppxVar1[2];
      ppxVar1 = ppxVar1 + 2;
    } while (text_00 != (ParserChar *)0x0);
  }
  if ((*pbVar4 & 1) == 0) {
    pbVar4[0x28] = 0;
    pbVar4[0x29] = 0;
    pbVar4[0x2a] = 0;
    pbVar4[0x2b] = 0;
    pbVar4[0x2c] = 0;
    pbVar4[0x2d] = 0;
    pbVar4[0x2e] = 0;
    pbVar4[0x2f] = 0;
    pbVar4[0x30] = 0;
    pbVar4[0x31] = 0;
    pbVar4[0x32] = 0;
    pbVar4[0x33] = 0;
    pbVar4[0x34] = 0;
    pbVar4[0x35] = 0;
    pbVar4[0x36] = 0;
    pbVar4[0x37] = 0;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__node( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__node( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

node__AttributeData* attributeData = newData<node__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_NAME:
    {

attributeData->name = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_SID:
    {

attributeData->sid = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__sid_type(attributeData->sid, strlen(attributeData->sid));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_NODE,
            HASH_ATTRIBUTE_SID,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_TYPE:
    {
bool failed;
attributeData->type = Utils::toEnum<ENUM__node_enum, StringHash, ENUM__node_enum__COUNT>(attributeValue, failed, ENUM__node_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_NODE,
        HASH_ATTRIBUTE_TYPE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_LAYER:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->layer, &validate__Name, HASH_ELEMENT_NODE, HASH_ATTRIBUTE_LAYER);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->layer);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->layer);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_NODE,
        HASH_ATTRIBUTE_LAYER,
        attributeValue))
{
    return false;
}

if ( !failed )
    attributeData->present_attributes |= node__AttributeData::ATTRIBUTE_LAYER_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_NODE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & node__AttributeData::ATTRIBUTE_LAYER_PRESENT) == 0)
{
    attributeData->layer = GeneratedSaxParser::XSList<ParserString>();
}


    return true;
}